

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Srm2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Rpr_t *__dest;
  int *__dest_00;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  uint fLatchA;
  size_t sVar6;
  char *pcVar7;
  char pFileName [10];
  uint local_4c;
  char local_48 [16];
  char *local_38;
  
  fLatchA = 0;
  Extra_UtilGetoptReset();
  local_4c = 0;
  bVar1 = false;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"abvh"), iVar2 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x62) {
      local_4c = local_4c ^ 1;
    }
    else {
      if (iVar2 != 0x61) {
        Abc_Print(-2,"usage: &srm2 [-abvh] <PartA_FileName> <PartB_FileName>\n");
        Abc_Print(-2,"\t         writes speculatively reduced model into file \"%s\"\n",local_48);
        Abc_Print(-2,"\t         only preserves equivalences across PartA and PartB\n");
        pcVar7 = "yes";
        pcVar5 = "yes";
        if (fLatchA == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-a     : toggle using latches only in PartA [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (local_4c == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-b     : toggle using latches only in PartB [default = %s]\n",pcVar5);
        if (!bVar1) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
        pcVar5 = "\t-h     : print the command usage\n";
        iVar2 = -2;
LAB_0027f4ae:
        Abc_Print(iVar2,pcVar5);
        return 1;
      }
      fLatchA = fLatchA ^ 1;
    }
  }
  pGVar4 = pAbc->pGia;
  if (pGVar4 == (Gia_Man_t *)0x0) {
    pcVar5 = "Abc_CommandAbc9Srm2(): There is no AIG.\n";
  }
  else {
    if ((pGVar4->pReprs == (Gia_Rpr_t *)0x0) || (pGVar4->pNexts == (int *)0x0)) {
      Abc_Print(-1,"Equivalences are not defined.\n");
      return 0;
    }
    if (globalUtilOptind + 2 == argc) {
      local_38 = argv[globalUtilOptind];
      pcVar5 = argv[(long)globalUtilOptind + 1];
      builtin_strncpy(local_48,"gsrm.aig",9);
      pGVar3 = Gia_ManDup(pGVar4);
      sVar6 = (long)pGVar3->nObjs << 2;
      __dest = (Gia_Rpr_t *)malloc(sVar6);
      pGVar3->pReprs = __dest;
      pGVar4 = pAbc->pGia;
      memcpy(__dest,pGVar4->pReprs,sVar6);
      sVar6 = (long)pGVar3->nObjs << 2;
      __dest_00 = (int *)malloc(sVar6);
      pGVar3->pNexts = __dest_00;
      memcpy(__dest_00,pGVar4->pNexts,sVar6);
      iVar2 = Gia_ManFilterEquivsForSpeculation(pGVar3,local_38,pcVar5,fLatchA,local_4c);
      if (iVar2 != 0) {
        pGVar4 = Gia_ManSpecReduce(pGVar3,0,0,1,0,0);
        Gia_ManStop(pGVar3);
        if (pGVar4 == (Gia_Man_t *)0x0) {
          return 0;
        }
        pGVar3 = Gia_ManSeqStructSweep(pGVar4,1,1,0);
        Gia_ManStop(pGVar4);
        Gia_AigerWrite(pGVar3,local_48,0,0,0);
        Abc_Print(1,"Speculatively reduced model was written into file \"%s\".\n",local_48);
        Gia_ManPrintStatsShort(pGVar3);
        Gia_ManStop(pGVar3);
        return 0;
      }
      Gia_ManStop(pGVar3);
      pcVar5 = "Filtering equivalences has failed.\n";
    }
    else {
      pcVar5 = "Abc_CommandAbc9Srm2(): Expecting two file names on the command line.\n";
    }
  }
  iVar2 = -1;
  goto LAB_0027f4ae;
}

Assistant:

int Abc_CommandAbc9Srm2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char pFileName[10], * pFileName1, * pFileName2;
    Gia_Man_t * pTemp, * pAux;
    int fLatchA = 0, fLatchB = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "abvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fLatchA ^= 1;
            break;
        case 'b':
            fLatchB ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm2(): There is no AIG.\n" );
        return 1;
    }
    if ( pAbc->pGia->pReprs == NULL || pAbc->pGia->pNexts == NULL )
    {
        Abc_Print( -1, "Equivalences are not defined.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm2(): Expecting two file names on the command line.\n" );
        return 1;
    }
    // get the input file name
    pFileName1 = argv[globalUtilOptind];
    pFileName2 = argv[globalUtilOptind+1];
    // create file name
    sprintf(pFileName,  "gsrm.aig" );
    pTemp = Gia_ManDup( pAbc->pGia );
    // copy equivalences
    pTemp->pReprs = ABC_ALLOC( Gia_Rpr_t, Gia_ManObjNum(pTemp) );
    memcpy( pTemp->pReprs, pAbc->pGia->pReprs, sizeof(Gia_Rpr_t) * Gia_ManObjNum(pTemp) );
    pTemp->pNexts = ABC_ALLOC( int, Gia_ManObjNum(pTemp) );
    memcpy( pTemp->pNexts, pAbc->pGia->pNexts, sizeof(int) * Gia_ManObjNum(pTemp) );
//Gia_ManPrintStats( pTemp, 0 );
    // filter the classes
    if ( !Gia_ManFilterEquivsForSpeculation( pTemp, pFileName1, pFileName2, fLatchA, fLatchB ) )
    {
        Gia_ManStop( pTemp );
        Abc_Print( -1, "Filtering equivalences has failed.\n" );
        return 1;
    }
//Gia_ManPrintStats( pTemp, 0 );
    pTemp = Gia_ManSpecReduce( pAux = pTemp, 0, 0, 1, 0, 0 );
    Gia_ManStop( pAux );
    if ( pTemp )
    {
        pTemp = Gia_ManSeqStructSweep( pAux = pTemp, 1, 1, 0 );
        Gia_ManStop( pAux );

        Gia_AigerWrite( pTemp, pFileName, 0, 0, 0 );
        Abc_Print( 1, "Speculatively reduced model was written into file \"%s\".\n", pFileName );
        Gia_ManPrintStatsShort( pTemp );
        Gia_ManStop( pTemp );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &srm2 [-abvh] <PartA_FileName> <PartB_FileName>\n" );
    Abc_Print( -2, "\t         writes speculatively reduced model into file \"%s\"\n", pFileName );
    Abc_Print( -2, "\t         only preserves equivalences across PartA and PartB\n" );
    Abc_Print( -2, "\t-a     : toggle using latches only in PartA [default = %s]\n", fLatchA? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle using latches only in PartB [default = %s]\n", fLatchB? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}